

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::Prev(DBIter *this)

{
  Comparator *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long extraout_RDX;
  pointer local_40;
  size_type local_38;
  undefined8 local_30;
  long local_28;
  
  if (this->direction_ == kForward) {
    iVar2 = (*this->iter_->_vptr_Iterator[8])();
    std::__cxx11::string::assign((char *)&this->saved_key_,CONCAT44(extraout_var,iVar2));
    do {
      (*this->iter_->_vptr_Iterator[7])();
      iVar2 = (*this->iter_->_vptr_Iterator[2])();
      if ((char)iVar2 == '\0') {
        this->valid_ = false;
        (this->saved_key_)._M_string_length = 0;
        *(this->saved_key_)._M_dataplus._M_p = '\0';
        ClearSavedValue(this);
        return;
      }
      pCVar1 = this->user_comparator_;
      iVar2 = (*this->iter_->_vptr_Iterator[8])();
      local_30 = CONCAT44(extraout_var_00,iVar2);
      local_28 = extraout_RDX + -8;
      local_40 = (this->saved_key_)._M_dataplus._M_p;
      local_38 = (this->saved_key_)._M_string_length;
      iVar2 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_30,&local_40);
    } while (-1 < iVar2);
    this->direction_ = kReverse;
  }
  FindPrevUserEntry(this);
  return;
}

Assistant:

void DBIter::Prev() {
  assert(valid_);

  if (direction_ == kForward) {  // Switch directions?
    // iter_ is pointing at the current entry.  Scan backwards until
    // the key changes so we can use the normal reverse scanning code.
    assert(iter_->Valid());  // Otherwise valid_ would have been false
    SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
    while (true) {
      iter_->Prev();
      if (!iter_->Valid()) {
        valid_ = false;
        saved_key_.clear();
        ClearSavedValue();
        return;
      }
      if (user_comparator_->Compare(ExtractUserKey(iter_->key()), saved_key_) <
          0) {
        break;
      }
    }
    direction_ = kReverse;
  }

  FindPrevUserEntry();
}